

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cc
# Opt level: O0

bool __thiscall tt::net::TimerNode::isValid(TimerNode *this)

{
  bool bVar1;
  size_t temp;
  timeval now;
  TimerNode *this_local;
  
  now.tv_usec = (__suseconds_t)this;
  gettimeofday((timeval *)&temp,(__timezone_ptr_t)0x0);
  bVar1 = this->expiredTime_ <= (ulong)(((long)temp % 10000) * 1000 + now.tv_sec / 1000);
  if (bVar1) {
    setDeleted(this);
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

bool TimerNode::isValid() {
  struct timeval now;
  gettimeofday(&now, NULL);
  size_t temp = (((now.tv_sec % 10000) * 1000) + (now.tv_usec / 1000));
  if (temp < expiredTime_)
    return true;
  else {
    this->setDeleted();
    return false;
  }
}